

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.h
# Opt level: O1

bool __thiscall Func::DoGlobOpt(Func *this)

{
  bool bVar1;
  ExecutionMode EVar2;
  uint uVar3;
  uint uVar4;
  BOOL BVar5;
  JITTimeFunctionBody *pJVar6;
  FunctionJITTimeInfo *pFVar7;
  
  pJVar6 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
  uVar3 = JITTimeFunctionBody::GetSourceContextId(pJVar6);
  pFVar7 = JITTimeWorkItem::GetJITTimeInfo(this->m_workItem);
  uVar4 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar7);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,GlobOptPhase,uVar3,uVar4);
  if ((((!bVar1) && (EVar2 = JITTimeWorkItem::GetJitMode(this->m_workItem), EVar2 != SimpleJit)) &&
      ((BVar5 = HasTry(this->topFunc), BVar5 == 0 ||
       (bVar1 = CanOptimizeTryCatch(this->topFunc), bVar1)))) &&
     ((bVar1 = HasFinally(this->topFunc), !bVar1 ||
      (bVar1 = CanOptimizeTryFinally(this->topFunc), bVar1)))) {
    pJVar6 = JITTimeWorkItem::GetJITFunctionBody(this->topFunc->m_workItem);
    bVar1 = JITTimeFunctionBody::IsCoroutine(pJVar6);
    if (!bVar1) {
      return true;
    }
    pJVar6 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
    uVar3 = JITTimeFunctionBody::GetSourceContextId(pJVar6);
    pFVar7 = JITTimeWorkItem::GetJITTimeInfo(this->m_workItem);
    uVar4 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar7);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,GeneratorGlobOptPhase,uVar3,uVar4);
    return !bVar1;
  }
  return false;
}

Assistant:

bool DoGlobOpt() const
    {
        return
            !PHASE_OFF(Js::GlobOptPhase, this) && !IsSimpleJit() &&
            (!GetTopFunc()->HasTry() || GetTopFunc()->CanOptimizeTryCatch()) &&
            (!GetTopFunc()->HasFinally() || GetTopFunc()->CanOptimizeTryFinally()) &&
            (!GetTopFunc()->GetJITFunctionBody()->IsCoroutine() || !PHASE_OFF(Js::GeneratorGlobOptPhase, this));
    }